

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QRectF * __thiscall QGraphicsItem::mapRectToScene(QGraphicsItem *this,QRectF *rect)

{
  bool bVar1;
  QGraphicsItemPrivate *pQVar2;
  long in_RSI;
  QRectF *in_RDI;
  qreal dy;
  QGraphicsItemPrivate *in_stack_ffffffffffffffd0;
  QRectF *this_00;
  
  this_00 = in_RDI;
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
            ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *)
             (in_RSI + 8));
  bVar1 = QGraphicsItemPrivate::hasTranslateOnlySceneTransform(in_stack_ffffffffffffffd0);
  if (bVar1) {
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RSI + 8));
    dy = QTransform::dx(&pQVar2->sceneTransform);
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RSI + 8));
    QTransform::dy(&pQVar2->sceneTransform);
    QRectF::translated(this_00,(qreal)in_RDI,dy);
  }
  else {
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )(in_RSI + 8));
    QTransform::mapRect((QRectF *)in_RDI);
  }
  return this_00;
}

Assistant:

QRectF QGraphicsItem::mapRectToScene(const QRectF &rect) const
{
    if (d_ptr->hasTranslateOnlySceneTransform())
        return rect.translated(d_ptr->sceneTransform.dx(), d_ptr->sceneTransform.dy());
    return d_ptr->sceneTransform.mapRect(rect);
}